

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O1

bool __thiscall QPainterPath::intersects(QPainterPath *this,QRectF *rect)

{
  double *pdVar1;
  QPainterPathPrivate *pQVar2;
  Element *pEVar3;
  ulong uVar4;
  char cVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  QPointF local_68;
  double local_58;
  double dStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d_ptr).d.ptr;
  if ((pQVar2 != (QPainterPathPrivate *)0x0) && ((int)(pQVar2->elements).d.size == 1)) {
    pEVar3 = (pQVar2->elements).d.ptr;
    local_58 = pEVar3->x;
    dStack_50 = pEVar3->y;
    cVar5 = QRectF::contains((QPointF *)rect);
    bVar6 = true;
    if (cVar5 != '\0') goto LAB_003e8bb3;
  }
  pQVar2 = (this->d_ptr).d.ptr;
  if ((pQVar2 != (QPainterPathPrivate *)0x0) &&
     (((pQVar2->elements).d.size != 1 || (((pQVar2->elements).d.ptr)->type != MoveToElement)))) {
    if (pQVar2 == (QPainterPathPrivate *)0x0) {
      local_80 = 0.0;
      local_78 = 0.0;
      local_88 = 0.0;
      local_70 = 0.0;
    }
    else {
      if ((pQVar2->field_0x84 & 4) != 0) {
        computeControlPointRect(this);
      }
      local_70 = (pQVar2->controlBounds).xp;
      local_88 = (pQVar2->controlBounds).yp;
      local_78 = (pQVar2->controlBounds).w;
      local_80 = (pQVar2->controlBounds).h;
    }
    local_48 = 0xffffffff;
    uStack_44 = 0xffffffff;
    uStack_40 = 0xffffffff;
    uStack_3c = 0xffffffff;
    local_58 = -NAN;
    dStack_50 = -NAN;
    QRectF::normalized();
    dVar10 = local_78 + local_70;
    if (local_70 <= local_58) {
      local_70 = local_58;
    }
    dVar9 = local_58 + (double)CONCAT44(uStack_44,local_48);
    if (dVar10 <= dVar9) {
      dVar9 = dVar10;
    }
    if (local_70 <= dVar9) {
      dVar10 = local_80 + local_88;
      if (local_88 <= dStack_50) {
        local_88 = dStack_50;
      }
      dVar9 = dStack_50 + (double)CONCAT44(uStack_3c,uStack_40);
      if (dVar10 <= dVar9) {
        dVar9 = dVar10;
      }
      if (local_88 <= dVar9) {
        bVar6 = qt_painterpath_check_crossing(this,rect);
        if (!bVar6) {
          local_68.xp = rect->w * 0.5 + rect->xp;
          local_68.yp = rect->h * 0.5 + rect->yp;
          bVar6 = contains(this,&local_68);
          if (!bVar6) {
            pQVar2 = (this->d_ptr).d.ptr;
            bVar6 = (pQVar2->elements).d.size != 0;
            if (bVar6) {
              lVar7 = 0x10;
              uVar8 = 0;
              do {
                pEVar3 = (pQVar2->elements).d.ptr;
                if (*(int *)((long)&pEVar3->x + lVar7) == 0) {
                  pdVar1 = (double *)((long)pEVar3 + lVar7 + -0x10);
                  local_68.xp = *pdVar1;
                  local_68.yp = pdVar1[1];
                  cVar5 = QRectF::contains((QPointF *)rect);
                  if (cVar5 != '\0') goto LAB_003e8c0e;
                }
                uVar8 = uVar8 + 1;
                lVar7 = lVar7 + 0x18;
                uVar4 = (pQVar2->elements).d.size;
                bVar6 = uVar8 < uVar4;
              } while (uVar8 < uVar4);
            }
            goto LAB_003e8bb3;
          }
        }
LAB_003e8c0e:
        bVar6 = true;
        goto LAB_003e8bb3;
      }
    }
  }
  bVar6 = false;
LAB_003e8bb3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QPainterPath::intersects(const QRectF &rect) const
{
    if (elementCount() == 1 && rect.contains(elementAt(0)))
        return true;

    if (isEmpty())
        return false;

    QRectF cp = controlPointRect();
    QRectF rn = rect.normalized();

    // QRectF::intersects returns false if one of the rects is a null rect
    // which would happen for a painter path consisting of a vertical or
    // horizontal line
    if (qMax(rn.left(), cp.left()) > qMin(rn.right(), cp.right())
        || qMax(rn.top(), cp.top()) > qMin(rn.bottom(), cp.bottom()))
        return false;

    // If any path element cross the rect its bound to be an intersection
    if (qt_painterpath_check_crossing(this, rect))
        return true;

    if (contains(rect.center()))
        return true;

    Q_D(QPainterPath);

    // Check if the rectangle surrounds any subpath...
    for (int i=0; i<d->elements.size(); ++i) {
        const Element &e = d->elements.at(i);
        if (e.type == QPainterPath::MoveToElement && rect.contains(e))
            return true;
    }

    return false;
}